

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

char * fctstr_clone_lower(char *s)

{
  __int32_t *p_Var1;
  size_t sVar2;
  char *pcVar3;
  __int32_t **pp_Var4;
  long lVar5;
  
  if (s == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar2 = strlen(s);
    pcVar3 = (char *)malloc(sVar2 + 2);
    if (sVar2 != 0xffffffffffffffff) {
      pp_Var4 = __ctype_tolower_loc();
      p_Var1 = *pp_Var4;
      lVar5 = 0;
      do {
        pcVar3[lVar5] = (char)p_Var1[s[lVar5]];
        lVar5 = lVar5 + 1;
      } while (sVar2 + 1 != lVar5);
    }
  }
  return pcVar3;
}

Assistant:

static char*
fctstr_clone_lower(char const *s)
{
    char *k =NULL;
    size_t klen =0;
    size_t i;
    if ( s == NULL )
    {
        return NULL;
    }
    klen = strlen(s)+1;
    k = (char*)malloc(sizeof(char)*klen+1);
    for ( i=0; i != klen; ++i )
    {
        k[i] = (char)tolower(s[i]);
    }
    return k;
}